

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

void __thiscall irr::video::COpenGLDriver::setMaterial(COpenGLDriver *this,SMaterial *material)

{
  ITexture *texture;
  u8 uVar1;
  undefined2 uVar2;
  f32 fVar3;
  f32 fVar4;
  f32 fVar5;
  SColor SVar6;
  f32 fVar7;
  f32 fVar8;
  f32 fVar9;
  E_MATERIAL_TYPE EVar10;
  SColor SVar11;
  SColor SVar12;
  SColor SVar13;
  undefined4 *puVar14;
  long lVar15;
  SMaterialLayer *this_00;
  SMaterial *other;
  u32 index;
  ulong uVar16;
  
  lVar15 = 4;
  this_00 = (this->Material).TextureLayers;
  other = material;
  do {
    SMaterialLayer::operator=(this_00,other->TextureLayers);
    other = (SMaterial *)(other->TextureLayers + 1);
    this_00 = this_00 + 1;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  *(undefined2 *)&(this->Material).field_0xb0 = *(undefined2 *)&material->field_0xb0;
  EVar10 = material->MaterialType;
  SVar11.color = (material->AmbientColor).color;
  SVar12.color = (material->DiffuseColor).color;
  SVar13.color = (material->EmissiveColor).color;
  SVar6.color = (material->SpecularColor).color;
  fVar7 = material->Shininess;
  fVar8 = material->MaterialTypeParam;
  fVar9 = material->Thickness;
  uVar1 = material->AntiAliasing;
  uVar2 = *(undefined2 *)&material->field_0xa2;
  fVar3 = material->BlendFactor;
  fVar4 = material->PolygonOffsetDepthBias;
  fVar5 = material->PolygonOffsetSlopeScale;
  (this->Material).ZBuffer = material->ZBuffer;
  (this->Material).AntiAliasing = uVar1;
  *(undefined2 *)&(this->Material).field_0xa2 = uVar2;
  (this->Material).BlendFactor = fVar3;
  (this->Material).PolygonOffsetDepthBias = fVar4;
  (this->Material).PolygonOffsetSlopeScale = fVar5;
  (this->Material).SpecularColor = (SColor)SVar6.color;
  (this->Material).Shininess = fVar7;
  (this->Material).MaterialTypeParam = fVar8;
  (this->Material).Thickness = fVar9;
  (this->Material).MaterialType = EVar10;
  (this->Material).AmbientColor = (SColor)SVar11.color;
  (this->Material).DiffuseColor = (SColor)SVar12.color;
  (this->Material).EmissiveColor = (SColor)SVar13.color;
  SOverrideMaterial::apply(&(this->super_CNullDriver).OverrideMaterial,&this->Material);
  if (this->field_0x6c3 != '\0') {
    lVar15 = 0xdf8;
    uVar16 = 0;
    do {
      index = (u32)uVar16;
      if (uVar16 < 4) {
        texture = *(ITexture **)
                   ((long)&(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver + lVar15)
        ;
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::STextureCache::set
                  (&(this->CacheHandler->
                    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ).TextureCache,index,texture,EST_ACTIVE_ON_CHANGE);
        if (texture != (ITexture *)0x0) {
          puVar14 = *(undefined4 **)((long)material + lVar15 + -0xde0);
          if (puVar14 == (undefined4 *)0x0) {
            puVar14 = &core::IdentityMatrix;
          }
          (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[6])
                    (this,(ulong)(index + 3),puVar14);
        }
      }
      else {
        COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ::STextureCache::set
                  (&(this->CacheHandler->
                    super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                    ).TextureCache,index,(ITexture *)0x0,EST_ACTIVE_ON_CHANGE);
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x20;
    } while (uVar16 < (byte)this->field_0x6c3);
  }
  return;
}

Assistant:

void COpenGLDriver::setMaterial(const SMaterial &material)
{
	Material = material;
	OverrideMaterial.apply(Material);

	for (u32 i = 0; i < Feature.MaxTextureUnits; ++i) {
		const ITexture *texture = Material.getTexture(i);
		CacheHandler->getTextureCache().set(i, texture, EST_ACTIVE_ON_CHANGE);
		if (texture) {
			setTransform((E_TRANSFORMATION_STATE)(ETS_TEXTURE_0 + i), material.getTextureMatrix(i));
		}
	}
}